

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall CUI::RenderPopupMenus(CUI *this)

{
  anon_class_48_5_9f8a5a3d *paVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CUIRect CVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  CUI *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  bool Active;
  bool Inside;
  uint i;
  bool MousePressed;
  CUIRect PopupRect;
  CUIRect *in_stack_ffffffffffffff68;
  CUI *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  float nw;
  bool local_5b;
  uint local_58;
  vector4_base<float> local_38;
  int in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  vec4 *in_stack_ffffffffffffffe0;
  CUIRect *this_00;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = MouseButton(in_RDI,0);
  local_5b = true;
  if (!bVar6) {
    local_5b = MouseButton(in_RDI,1);
  }
  if ((RenderPopupMenus()::s_MousePressed == '\0') &&
     (iVar8 = __cxa_guard_acquire(&RenderPopupMenus()::s_MousePressed), iVar8 != 0)) {
    RenderPopupMenus::s_MousePressed = local_5b;
    __cxa_guard_release(&RenderPopupMenus()::s_MousePressed);
  }
  for (local_58 = 0; local_58 < in_RDI->m_NumPopupMenus; local_58 = local_58 + 1) {
    bVar6 = MouseInside(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    bVar9 = local_58 == in_RDI->m_NumPopupMenus - 1;
    if (bVar9) {
      SetHotItem(in_RDI,in_RDI->m_aPopupMenus + local_58);
    }
    paVar1 = in_RDI->m_aPopupMenus + local_58;
    this_00 = *(CUIRect **)&paVar1->m_Rect;
    uVar3 = (paVar1->m_Rect).w;
    uVar4 = (paVar1->m_Rect).h;
    CVar5.h = (float)uVar4;
    CVar5.w = (float)uVar3;
    in_stack_ffffffffffffff70 = (CUI *)&stack0xffffffffffffffd8;
    nw = 0.75;
    vector4_base<float>::vector4_base
              ((vector4_base<float> *)in_stack_ffffffffffffff70,0.5,0.5,0.5,0.75);
    CUIRect::Draw(this_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                  in_stack_ffffffffffffffd8);
    CUIRect::Margin((CUIRect *)CONCAT44(nw,in_stack_ffffffffffffff78),
                    (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),in_stack_ffffffffffffff68);
    vector4_base<float>::vector4_base(&local_38,0.0,0.0,0.0,nw);
    CUIRect::Draw(this_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                  in_stack_ffffffffffffffd8);
    CUIRect::Margin((CUIRect *)CONCAT44(nw,in_stack_ffffffffffffff78),
                    (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),in_stack_ffffffffffffff68);
    CVar5._0_8_ = this_00;
    bVar7 = (*in_RDI->m_aPopupMenus[local_58].m_pfnFunc)
                      (in_RDI->m_aPopupMenus[local_58].m_pContext,CVar5);
    if (bVar7) {
      in_RDI->m_NumPopupMenus = local_58;
    }
    else if ((in_RDI->m_aPopupMenus[local_58].m_New & 1U) == 0) {
      if ((bVar9) &&
         ((((!bVar6 && ((RenderPopupMenus::s_MousePressed & 1U) != 0)) && (local_5b == false)) ||
          (bVar6 = ConsumeHotkey(in_RDI,2), bVar6)))) {
        in_RDI->m_NumPopupMenus = in_RDI->m_NumPopupMenus - 1;
      }
    }
    else {
      in_RDI->m_aPopupMenus[local_58].m_New = false;
    }
  }
  RenderPopupMenus::s_MousePressed = local_5b;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CUI::RenderPopupMenus()
{
	const bool MousePressed = MouseButton(0) || MouseButton(1);
	static bool s_MousePressed = MousePressed;

	for(unsigned i = 0; i < m_NumPopupMenus; i++)
	{
		const bool Inside = MouseInside(&m_aPopupMenus[i].m_Rect);
		const bool Active = i == m_NumPopupMenus - 1;

		// prevent activation of UI elements outside of active popup
		if(Active)
			SetHotItem(&m_aPopupMenus[i]);

		CUIRect PopupRect = m_aPopupMenus[i].m_Rect;
		PopupRect.Draw(vec4(0.5f, 0.5f, 0.5f, 0.75f), 3.0f, m_aPopupMenus[i].m_Corners);
		PopupRect.Margin(1.0f, &PopupRect);
		PopupRect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.75f), 3.0f, m_aPopupMenus[i].m_Corners);
		PopupRect.Margin(4.0f, &PopupRect);

		if(m_aPopupMenus[i].m_pfnFunc(m_aPopupMenus[i].m_pContext, PopupRect))
			m_NumPopupMenus = i; // close this popup and all above it
		else if(m_aPopupMenus[i].m_New)
			m_aPopupMenus[i].m_New = false; // prevent popup from being closed by the click that opens it
		else if(Active && ((!Inside && s_MousePressed && !MousePressed) || ConsumeHotkey(HOTKEY_ESCAPE)))
			m_NumPopupMenus--; // close top-most popup by clicking outside and with escape
	}

	s_MousePressed = MousePressed;
}